

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_width<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                 *handler)

{
  error_handler eVar1;
  uint uVar2;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *in_RAX;
  assertion_failure *this;
  error_handler *this_00;
  error_handler *peVar3;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_18;
  
  if (begin == end) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  eVar1 = (error_handler)*begin;
  if ((byte)((char)eVar1 - 0x30U) < 10) {
    begin = begin + 1;
    uVar2 = 0;
    peVar3 = (error_handler *)begin;
    if (eVar1 != (error_handler)0x30) {
      do {
        this_00 = peVar3;
        if (0xccccccc < uVar2) goto LAB_001350f4;
        uVar2 = ((uint)(byte)eVar1 + uVar2 * 10) - 0x30;
        begin = end;
        if (this_00 == (error_handler *)end) break;
        eVar1 = *this_00;
        begin = (char *)this_00;
        peVar3 = this_00 + 1;
      } while ((byte)((char)eVar1 - 0x30U) < 10);
      if ((int)uVar2 < 0) {
LAB_001350f4:
        error_handler::on_error(this_00,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_align_spec).width_ = uVar2;
  }
  else if (eVar1 == (error_handler)0x7b) {
    peVar3 = (error_handler *)(begin + 1);
    local_18.handler = in_RAX;
    if (peVar3 != (error_handler *)end) {
      local_18.handler = handler;
      peVar3 = (error_handler *)
               parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                         ((char *)peVar3,end,&local_18);
    }
    if ((peVar3 == (error_handler *)end) || (*peVar3 != (error_handler)0x7d)) {
      error_handler::on_error(peVar3,"invalid format string");
    }
    begin = (char *)(peVar3 + 1);
  }
  return (char *)(error_handler *)begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_width(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}